

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_unset(kvtree *hash,char *key)

{
  kvtree_elem *elem_00;
  kvtree_elem *elem;
  char *key_local;
  kvtree *hash_local;
  
  if ((hash != (kvtree *)0x0) &&
     (elem_00 = kvtree_elem_extract(hash,key), elem_00 != (kvtree_elem *)0x0)) {
    kvtree_elem_delete(elem_00);
  }
  return 0;
}

Assistant:

int kvtree_unset(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree_elem_delete(elem);
  }
  return KVTREE_SUCCESS;
}